

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall vmips::Function::add_ret(Function *this)

{
  int iVar1;
  element_type *peVar2;
  shared_ptr<vmips::Instruction> local_b8 [2];
  allocator local_91;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  Function *local_10;
  Function *this_local;
  
  local_10 = this;
  if (add_ret()::ending == '\0') {
    iVar1 = __cxa_guard_acquire(&add_ret()::ending);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"j ",&local_91);
      std::operator+(local_70,(char *)local_90);
      std::operator+(local_50,local_70);
      std::operator+(local_30,(char *)local_50);
      std::make_shared<vmips::text,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &add_ret::ending);
      std::__cxx11::string::~string((string *)local_30);
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      __cxa_atexit(std::shared_ptr<vmips::text>::~shared_ptr,&add_ret::ending,&__dso_handle);
      __cxa_guard_release(&add_ret()::ending);
    }
  }
  peVar2 = std::__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->cursor);
  std::shared_ptr<vmips::Instruction>::shared_ptr<vmips::text,void>(local_b8,&add_ret::ending);
  std::
  vector<std::shared_ptr<vmips::Instruction>,_std::allocator<std::shared_ptr<vmips::Instruction>_>_>
  ::push_back(&peVar2->instructions,local_b8);
  std::shared_ptr<vmips::Instruction>::~shared_ptr(local_b8);
  return;
}

Assistant:

void Function::add_ret() {
    static auto ending = std::make_shared<text>(std::string{"j "} + ".L" + this->name + "_epilogue");
    cursor->instructions.push_back(ending);
}